

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O2

EC_T_DWORD ecatNotifyCallback(EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  EC_T_DWORD EVar1;
  
  EVar1 = 0x9811000b;
  if ((pParms != (EC_T_NOTIFYPARMS *)0x0) &&
     ((CEmNotification *)pParms->pCallerData != (CEmNotification *)0x0)) {
    if ((dwCode & 0xffff0000) != 0x80000) {
      EVar1 = CEmNotification::ecatNotify((CEmNotification *)pParms->pCallerData,dwCode,pParms);
      return EVar1;
    }
    EVar1 = 0x98110000;
    if (dwCode == 0x80001) {
      CAtEmLogging::LogMsg(S_poLog,"Application notification code=%d received\n",1);
    }
  }
  return EVar1;
}

Assistant:

static EC_T_DWORD ecatNotifyCallback(
    EC_T_DWORD         dwCode,  /**< [in]   Notification code */
    EC_T_NOTIFYPARMS*  pParms   /**< [in]   Notification parameters */
                                         )
{
    EC_T_DWORD         dwRetVal                = EC_E_NOERROR;
    CEmNotification*   pNotifyInstance;

    if ((EC_NULL == pParms)||(EC_NULL==pParms->pCallerData))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    /* notification for application ? */
    if ((dwCode >= EC_NOTIFY_APP) && (dwCode <= EC_NOTIFY_APP+EC_NOTIFY_APP_MAX_CODE))
    {
        /*****************************************************/
        /* Demo code: Remove/change this in your application */
        /* to get here the API ecatNotifyApp(dwCode, pParms) has to be called */
        /*****************************************************/
        dwRetVal = myAppNotify(dwCode-EC_NOTIFY_APP, pParms);
    }
    else
    {
        pNotifyInstance = (CEmNotification*)pParms->pCallerData;

        /* call the default handler */
        dwRetVal = pNotifyInstance->ecatNotify(dwCode, pParms);
    }

Exit:
    return dwRetVal;
}